

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall tcu::MessageBuilder::MessageBuilder(MessageBuilder *this,MessageBuilder *other)

{
  string local_38 [32];
  MessageBuilder *local_18;
  MessageBuilder *other_local;
  MessageBuilder *this_local;
  
  this->m_log = other->m_log;
  local_18 = other;
  other_local = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_str);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str((string *)&this->m_str);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

MessageBuilder::MessageBuilder (const MessageBuilder& other)
	: m_log(other.m_log)
{
	m_str.str(other.m_str.str());
}